

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case0108(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_369;
  string local_368;
  Decl local_348;
  Decl local_280;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"int * * x ( ) { return 1 ; }",&local_31);
  Expectation::Expectation(&local_1b8);
  Decl::Decl(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"x",&local_369);
  pDVar1 = Decl::Function(&local_348,&local_368,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  Decl::Decl(&local_280,pDVar1);
  pEVar2 = Expectation::declaration(&local_1b8,&local_280);
  Expectation::Expectation(&local_100,pEVar2);
  bind(this,(int)local_30,(sockaddr *)&local_100,__len);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_280);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  Decl::~Decl(&local_348);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case0108()
{
    bind("int * * x ( ) { return 1 ; }",
         Expectation()
         .declaration(Decl().Function("x", ScopeKind::File)
                  .ty_.Basic(BasicTypeKind::Int_S)
                  .ty_.Derived(TypeKind::Pointer)
                  .ty_.Derived(TypeKind::Pointer)
                  .ty_.Derived(TypeKind::Function)));
}